

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

longdouble * __thiscall
baryonyx::linearize<long,long_double>
          (longdouble *__return_storage_ptr__,baryonyx *this,long p1x,longdouble p1y,long p2x,
          longdouble p2y,long value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double p;
  double m;
  long value_local;
  longdouble p2y_local;
  long p2x_local;
  longdouble p1y_local;
  long p1x_local;
  
  if ((baryonyx *)__return_storage_ptr__ == this) {
    details::fail_fast("Precondition","p1x - p2x != 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/utils.hpp"
                       ,"152");
  }
  auVar2._0_8_ = (double)(p1y - p2y) / (double)((long)__return_storage_ptr__ - (long)this);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (double)p2y;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = auVar2._0_8_;
  auVar1._0_8_ = (double)(long)this;
  auVar1._8_8_ = 0;
  auVar1 = vfnmadd213sd_fma(auVar1,auVar3,auVar5);
  auVar2._8_8_ = 0;
  auVar4._0_8_ = (double)p1x;
  auVar4._8_8_ = 0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar1._0_8_;
  auVar1 = vfmadd213sd_fma(auVar4,auVar2,auVar6);
  vroundsd_avx(auVar2,auVar1,10);
  return (longdouble *)((long)__return_storage_ptr__ - (long)this);
}

Assistant:

constexpr Ytype
linearize(Xtype p1x, Ytype p1y, Xtype p2x, Ytype p2y, Xtype value) noexcept
{
    bx_expects(p1x - p2x != 0);

    auto m = static_cast<double>(p1y - p2y) / static_cast<double>(p1x - p2x);
    auto p = static_cast<double>(p2y) - m * static_cast<double>(p2x);

    return static_cast<Ytype>(std::ceil(m * static_cast<double>(value) + p));
}